

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateDocumentInternal(xmlParserCtxtPtr ctxt,xmlValidCtxtPtr vctxt,xmlDocPtr doc)

{
  int iVar1;
  uint uVar2;
  xmlParserInputPtr input_00;
  xmlDtdPtr pxVar3;
  xmlParserInputPtr input;
  xmlChar *pxStack_40;
  int res;
  xmlChar *sysID;
  xmlNodePtr root;
  xmlDocPtr pxStack_28;
  int ret;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr vctxt_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (doc == (xmlDocPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else {
    pxStack_28 = doc;
    doc_local = (xmlDocPtr)vctxt;
    vctxt_local = (xmlValidCtxtPtr)ctxt;
    if ((doc->intSubset == (_xmlDtd *)0x0) && (doc->extSubset == (_xmlDtd *)0x0)) {
      xmlErrValid(vctxt,XML_DTD_NO_DTD,"no DTD found!\n",(char *)0x0);
      ctxt_local._4_4_ = 0;
    }
    else {
      if ((doc->intSubset != (_xmlDtd *)0x0) &&
         (((doc->intSubset->SystemID != (xmlChar *)0x0 ||
           (doc->intSubset->ExternalID != (xmlChar *)0x0)) && (doc->extSubset == (_xmlDtd *)0x0))))
      {
        pxStack_40 = (xmlChar *)0x0;
        if (doc->intSubset->SystemID != (xmlChar *)0x0) {
          iVar1 = xmlBuildURISafe(doc->intSubset->SystemID,doc->URL,&stack0xffffffffffffffc0);
          if (iVar1 < 0) {
            xmlVErrMemory((xmlValidCtxtPtr)doc_local);
            return 0;
          }
          if (iVar1 != 0) {
            xmlErrValid((xmlValidCtxtPtr)doc_local,XML_DTD_LOAD_ERROR,
                        "Could not build URI for external subset \"%s\"\n",
                        (char *)pxStack_28->intSubset->SystemID);
            return 0;
          }
        }
        if (vctxt_local == (xmlValidCtxtPtr)0x0) {
          pxVar3 = xmlParseDTD(pxStack_28->intSubset->ExternalID,pxStack_40);
          pxStack_28->extSubset = pxVar3;
        }
        else {
          input_00 = xmlLoadResource((xmlParserCtxtPtr)vctxt_local,(char *)pxStack_40,
                                     (char *)pxStack_28->intSubset->ExternalID,XML_RESOURCE_DTD);
          if (input_00 == (xmlParserInputPtr)0x0) {
            (*xmlFree)(pxStack_40);
            return 0;
          }
          pxVar3 = xmlCtxtParseDtd((xmlParserCtxtPtr)vctxt_local,input_00,
                                   pxStack_28->intSubset->ExternalID,pxStack_40);
          pxStack_28->extSubset = pxVar3;
        }
        if (pxStack_40 != (xmlChar *)0x0) {
          (*xmlFree)(pxStack_40);
        }
        if (pxStack_28->extSubset == (_xmlDtd *)0x0) {
          if (pxStack_28->intSubset->SystemID == (xmlChar *)0x0) {
            xmlErrValid((xmlValidCtxtPtr)doc_local,XML_DTD_LOAD_ERROR,
                        "Could not load the external subset \"%s\"\n",
                        (char *)pxStack_28->intSubset->ExternalID);
          }
          else {
            xmlErrValid((xmlValidCtxtPtr)doc_local,XML_DTD_LOAD_ERROR,
                        "Could not load the external subset \"%s\"\n",
                        (char *)pxStack_28->intSubset->SystemID);
          }
          return 0;
        }
      }
      if (pxStack_28->ids != (void *)0x0) {
        xmlFreeIDTable((xmlIDTablePtr)pxStack_28->ids);
        pxStack_28->ids = (void *)0x0;
      }
      if (pxStack_28->refs != (void *)0x0) {
        xmlFreeRefTable((xmlRefTablePtr)pxStack_28->refs);
        pxStack_28->refs = (void *)0x0;
      }
      root._4_4_ = xmlValidateDtdFinal((xmlValidCtxtPtr)doc_local,pxStack_28);
      iVar1 = xmlValidateRoot((xmlValidCtxtPtr)doc_local,pxStack_28);
      if (iVar1 == 0) {
        ctxt_local._4_4_ = 0;
      }
      else {
        sysID = (xmlChar *)xmlDocGetRootElement(pxStack_28);
        uVar2 = xmlValidateElement((xmlValidCtxtPtr)doc_local,pxStack_28,(xmlNodePtr)sysID);
        root._4_4_ = uVar2 & root._4_4_;
        uVar2 = xmlValidateDocumentFinal((xmlValidCtxtPtr)doc_local,pxStack_28);
        ctxt_local._4_4_ = uVar2 & root._4_4_;
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlValidateDocumentInternal(xmlParserCtxtPtr ctxt, xmlValidCtxtPtr vctxt,
                            xmlDocPtr doc) {
    int ret;
    xmlNodePtr root;

    if (doc == NULL)
        return(0);
    if ((doc->intSubset == NULL) && (doc->extSubset == NULL)) {
        xmlErrValid(vctxt, XML_DTD_NO_DTD,
	            "no DTD found!\n", NULL);
	return(0);
    }

    if ((doc->intSubset != NULL) && ((doc->intSubset->SystemID != NULL) ||
	(doc->intSubset->ExternalID != NULL)) && (doc->extSubset == NULL)) {
	xmlChar *sysID = NULL;

	if (doc->intSubset->SystemID != NULL) {
            int res;

            res = xmlBuildURISafe(doc->intSubset->SystemID, doc->URL, &sysID);
            if (res < 0) {
                xmlVErrMemory(vctxt);
                return 0;
            } else if (res != 0) {
                xmlErrValid(vctxt, XML_DTD_LOAD_ERROR,
			"Could not build URI for external subset \"%s\"\n",
			(const char *) doc->intSubset->SystemID);
		return 0;
	    }
	}

        if (ctxt != NULL) {
            xmlParserInputPtr input;

            input = xmlLoadResource(ctxt, (const char *) sysID,
                    (const char *) doc->intSubset->ExternalID,
                    XML_RESOURCE_DTD);
            if (input == NULL) {
                xmlFree(sysID);
                return 0;
            }

            doc->extSubset = xmlCtxtParseDtd(ctxt, input,
                                             doc->intSubset->ExternalID,
                                             sysID);
        } else {
            doc->extSubset = xmlParseDTD(doc->intSubset->ExternalID, sysID);
        }

	if (sysID != NULL)
	    xmlFree(sysID);
        if (doc->extSubset == NULL) {
	    if (doc->intSubset->SystemID != NULL) {
		xmlErrValid(vctxt, XML_DTD_LOAD_ERROR,
		       "Could not load the external subset \"%s\"\n",
		       (const char *) doc->intSubset->SystemID);
	    } else {
		xmlErrValid(vctxt, XML_DTD_LOAD_ERROR,
		       "Could not load the external subset \"%s\"\n",
		       (const char *) doc->intSubset->ExternalID);
	    }
	    return(0);
	}
    }

    if (doc->ids != NULL) {
          xmlFreeIDTable(doc->ids);
          doc->ids = NULL;
    }
    if (doc->refs != NULL) {
          xmlFreeRefTable(doc->refs);
          doc->refs = NULL;
    }
    ret = xmlValidateDtdFinal(vctxt, doc);
    if (!xmlValidateRoot(vctxt, doc)) return(0);

    root = xmlDocGetRootElement(doc);
    ret &= xmlValidateElement(vctxt, doc, root);
    ret &= xmlValidateDocumentFinal(vctxt, doc);
    return(ret);
}